

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O3

bool llvm::sys::getHostCPUFeatures(StringMap<bool,_llvm::MallocAllocator> *Features)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  undefined1 uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint in_XCR0;
  StringRef Key;
  StringRef Key_00;
  StringRef Key_01;
  StringRef Key_02;
  StringRef Key_03;
  StringRef Key_04;
  StringRef Key_05;
  StringRef Key_06;
  StringRef Key_07;
  StringRef Key_08;
  StringRef Key_09;
  StringRef Key_10;
  StringRef Key_11;
  StringRef Key_12;
  StringRef Key_13;
  StringRef Key_14;
  StringRef Key_15;
  StringRef Key_16;
  StringRef Key_17;
  StringRef Key_18;
  StringRef Key_19;
  StringRef Key_20;
  StringRef Key_21;
  StringRef Key_22;
  StringRef Key_23;
  StringRef Key_24;
  StringRef Key_25;
  StringRef Key_26;
  StringRef Key_27;
  StringRef Key_28;
  StringRef Key_29;
  StringRef Key_30;
  StringRef Key_31;
  StringRef Key_32;
  StringRef Key_33;
  StringRef Key_34;
  StringRef Key_35;
  StringRef Key_36;
  StringRef Key_37;
  StringRef Key_38;
  StringRef Key_39;
  StringRef Key_40;
  StringRef Key_41;
  StringRef Key_42;
  StringRef Key_43;
  StringRef Key_44;
  StringRef Key_45;
  StringRef Key_46;
  StringRef Key_47;
  StringRef Key_48;
  StringRef Key_49;
  StringRef Key_50;
  StringRef Key_51;
  StringRef Key_52;
  StringRef Key_53;
  StringRef Key_54;
  StringRef Key_55;
  StringRef Key_56;
  StringRef Key_57;
  StringRef Key_58;
  StringRef Key_59;
  StringRef Key_60;
  StringRef Key_61;
  StringRef Key_62;
  StringRef Key_63;
  StringRef Key_64;
  StringRef Key_65;
  StringRef Key_66;
  StringRef Key_67;
  StringRef Key_68;
  StringRef Key_69;
  StringRef Key_70;
  StringRef Key_71;
  StringRef Key_72;
  StringRef Key_73;
  StringRef Key_74;
  StringRef Key_75;
  pair<llvm::StringMapIterator<bool>,_bool> pVar12;
  uint local_50;
  uint local_40;
  uint local_3c;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar3 = *puVar1;
  if (uVar3 != 0) {
    puVar1 = (uint *)cpuid_Version_info(1);
    local_3c = *puVar1;
    uVar4 = puVar1[2];
    uVar8 = puVar1[3];
    Key.Length = 4;
    Key.Data = "cmov";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar4 >> 0xf) & 1;
    Key_00.Length = 3;
    Key_00.Data = "mmx";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_00);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar4 >> 0x17) & 1;
    Key_01.Length = 3;
    Key_01.Data = "sse";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_01);
    bVar5 = (byte)(uVar4 >> 0x18);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 1 & 1;
    Key_02.Length = 4;
    Key_02.Data = "sse2";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_02);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 2 & 1;
    Key_03.Length = 4;
    Key_03.Data = "sse3";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_03);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)uVar8 & 1;
    Key_04.Length = 6;
    Key_04.Data = "pclmul";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_04);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)uVar8 >> 1 & 1;
    Key_05.Length = 5;
    Key_05.Data = "ssse3";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_05);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 9) & 1;
    Key_06.Length = 4;
    Key_06.Data = "cx16";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_06);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0xd) & 1;
    Key_07.Length = 6;
    Key_07.Data = "sse4.1";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_07);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0x13) & 1;
    Key_08.Length = 6;
    Key_08.Data = "sse4.2";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_08);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0x14) & 1;
    Key_09.Length = 5;
    Key_09.Data = "movbe";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_09);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0x16) & 1;
    Key_10.Length = 6;
    Key_10.Data = "popcnt";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_10);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0x17) & 1;
    Key_11.Length = 3;
    Key_11.Data = "aes";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_11);
    bVar5 = (byte)(uVar8 >> 0x18);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 1 & 1;
    Key_12.Length = 5;
    Key_12.Data = "rdrnd";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_12);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 6 & 1;
    bVar11 = (~uVar8 & 0x18000000) == 0;
    if (bVar11) {
      local_3c = in_XCR0;
    }
    bVar11 = bVar11 && (~in_XCR0 & 6) == 0;
    uVar6 = ~local_3c;
    Key_13.Length = 3;
    Key_13.Data = "avx";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_13);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar11;
    Key_14.Length = 3;
    Key_14.Data = "fma";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_14);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0xc) & 1 & bVar11;
    Key_15.Length = 5;
    Key_15.Data = "xsave";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_15);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 2 & 1 & bVar11;
    Key_16.Length = 4;
    Key_16.Data = "f16c";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_16);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 5 & 1 & bVar11;
    puVar1 = (uint *)cpuid(0x80000000);
    uVar4 = *puVar1;
    local_50 = puVar1[1];
    local_40 = puVar1[2];
    uVar8 = puVar1[3];
    if (0x80000000 < uVar4) {
      puVar1 = (uint *)cpuid(0x80000001);
      local_3c = *puVar1;
      local_50 = puVar1[1];
      local_40 = puVar1[2];
      uVar8 = puVar1[3];
    }
    bVar9 = 0x80000000 < uVar4;
    Key_17.Length = 4;
    Key_17.Data = "sahf";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_17);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)uVar8 & bVar9;
    Key_18.Length = 5;
    Key_18.Data = "lzcnt";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_18);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((uVar8 & 0x20) >> 5) & bVar9;
    Key_19.Length = 5;
    Key_19.Data = "sse4a";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_19);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((uVar8 & 0x40) >> 6) & bVar9;
    Key_20.Length = 6;
    Key_20.Data = "prfchw";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_20);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 8) & 1 & bVar9;
    Key_21.Length = 3;
    Key_21.Data = "xop";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_21);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar9 && ((uVar8 >> 0xb & 1) != 0 && bVar11);
    Key_22.Length = 3;
    Key_22.Data = "lwp";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_22);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (short)uVar8 < 0 && bVar9;
    Key_23.Length = 4;
    Key_23.Data = "fma4";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_23);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = 0x80000000 < uVar4 && ((uVar8 >> 0x10 & 1) != 0 && bVar11);
    Key_24.Length = 3;
    Key_24.Data = "tbm";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_24);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0x15) & 1 & bVar9;
    Key_25.Length = 6;
    Key_25.Data = "mwaitx";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_25);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0x1d) & 1 & bVar9;
    if (0x80000007 < uVar4) {
      puVar1 = (uint *)cpuid(0x80000008);
      local_3c = *puVar1;
      local_50 = puVar1[1];
      local_40 = puVar1[2];
      uVar8 = puVar1[3];
    }
    bVar9 = bVar11 && (uVar6 & 0xe0) == 0;
    Key_26.Length = 6;
    Key_26.Data = "clzero";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_26);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)local_50 & 0x80000007 < uVar4;
    Key_27.Length = 8;
    Key_27.Data = "wbnoinvd";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_27);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_50 >> 9) & 1 & 0x80000007 < uVar4;
    if (6 < uVar3) {
      puVar1 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
      local_3c = *puVar1;
      local_50 = puVar1[1];
      local_40 = puVar1[2];
      uVar8 = puVar1[3];
    }
    uVar7 = (char)(local_50 & 0x20);
    if ((local_50 & 0x20) != 0) {
      uVar7 = bVar11;
    }
    bVar10 = 6 < uVar3;
    if (!bVar10) {
      uVar7 = 0;
    }
    Key_28.Length = 8;
    Key_28.Data = "fsgsbase";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_28);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (local_50 & 1) != 0 && bVar10;
    Key_29.Length = 3;
    Key_29.Data = "sgx";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_29);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((local_50 & 4) >> 2) & bVar10;
    Key_30.Length = 3;
    Key_30.Data = "bmi";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_30);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((local_50 & 8) >> 3) & bVar10;
    Key_31.Length = 4;
    Key_31.Data = "avx2";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_31);
    *(undefined1 *)
     (*(long *)pVar12.first.
               super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>.
               Ptr.
               super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_> +
     8) = uVar7;
    Key_32.Length = 4;
    Key_32.Data = "bmi2";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_32);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_50 >> 8) & 1 & bVar10;
    Key_33.Length = 7;
    Key_33.Data = "invpcid";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_33);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_50 >> 10) & 1 & bVar10;
    Key_34.Length = 3;
    Key_34.Data = "rtm";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_34);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_50 >> 0xb) & 1 & bVar10;
    if (uVar3 < 7) {
      Key_36.Length = 7;
      Key_36.Data = "avx512f";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_36);
      *(undefined1 *)
       (*(long *)pVar12.first.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                 .Ptr.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
       + 8) = 0;
    }
    else {
      Key_35.Length = 7;
      Key_35.Data = "avx512f";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_35);
      *(bool *)(*(long *)pVar12.first.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                         .Ptr.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
               + 8) = (local_50 >> 0x10 & 1) != 0 && bVar9;
    }
    bVar10 = 6 < uVar3;
    Key_37.Length = 8;
    Key_37.Data = "avx512dq";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_37);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = uVar3 >= 7 && ((local_50 >> 0x11 & 1) != 0 && bVar9);
    Key_38.Length = 6;
    Key_38.Data = "rdseed";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_38);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_50 >> 0x12) & 1 & bVar10;
    Key_39.Length = 3;
    Key_39.Data = "adx";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_39);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_50 >> 0x13) & 1 & bVar10;
    Key_40.Length = 10;
    Key_40.Data = "avx512ifma";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_40);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_50 >> 0x15) & 1 & bVar10 & bVar9;
    Key_41.Length = 10;
    Key_41.Data = "clflushopt";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_41);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_50 >> 0x17) & 1 & bVar10;
    bVar5 = (byte)(local_50 >> 0x18);
    Key_42.Length = 4;
    Key_42.Data = "clwb";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_42);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 & 1 & bVar10;
    if (uVar3 < 7) {
      Key_44.Length = 8;
      Key_44.Data = "avx512pf";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_44);
      *(undefined1 *)
       (*(long *)pVar12.first.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                 .Ptr.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
       + 8) = 0;
    }
    else {
      Key_43.Length = 8;
      Key_43.Data = "avx512pf";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_43);
      *(bool *)(*(long *)pVar12.first.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                         .Ptr.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
               + 8) = (local_50 >> 0x1a & 1) != 0 && bVar9;
    }
    Key_45.Length = 8;
    Key_45.Data = "avx512er";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_45);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = uVar3 >= 7 && ((local_50 >> 0x1b & 1) != 0 && bVar9);
    Key_46.Length = 8;
    Key_46.Data = "avx512cd";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_46);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 4 & 1 & 6 < uVar3 & bVar9;
    Key_47.Length = 3;
    Key_47.Data = "sha";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_47);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 5 & 1 & 6 < uVar3;
    if (uVar3 < 7) {
      Key_49.Length = 8;
      Key_49.Data = "avx512bw";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_49);
      *(undefined1 *)
       (*(long *)pVar12.first.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                 .Ptr.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
       + 8) = 0;
    }
    else {
      Key_48.Length = 8;
      Key_48.Data = "avx512bw";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_48);
      *(bool *)(*(long *)pVar12.first.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                         .Ptr.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
               + 8) = (local_50 >> 0x1e & 1) != 0 && bVar9;
    }
    bVar10 = 6 < uVar3;
    Key_50.Length = 8;
    Key_50.Data = "avx512vl";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_50);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = uVar3 >= 7 && ((int)local_50 < 0 && bVar9);
    Key_51.Length = 0xb;
    Key_51.Data = "prefetchwt1";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_51);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar10 & (byte)uVar8;
    Key_52.Length = 10;
    Key_52.Data = "avx512vbmi";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_52);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((uVar8 & 2) >> 1) & bVar10 & bVar9;
    Key_53.Length = 3;
    Key_53.Data = "pku";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_53);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((uVar8 & 0x10) >> 4) & bVar10;
    Key_54.Length = 7;
    Key_54.Data = "waitpkg";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_54);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((uVar8 & 0x20) >> 5) & bVar10;
    Key_55.Length = 0xb;
    Key_55.Data = "avx512vbmi2";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_55);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((uVar8 & 0x40) >> 6) & bVar10 & bVar9;
    Key_56.Length = 5;
    Key_56.Data = "shstk";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_56);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (char)(byte)uVar8 < '\0' && bVar10;
    Key_57.Length = 4;
    Key_57.Data = "gfni";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_57);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 8) & 1 & bVar10;
    if (uVar3 < 7) {
      Key_61.Length = 4;
      Key_61.Data = "vaes";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_61);
      *(undefined1 *)
       (*(long *)pVar12.first.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                 .Ptr.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
       + 8) = 0;
      Key_62.Length = 10;
      Key_62.Data = "vpclmulqdq";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_62);
      *(undefined1 *)
       (*(long *)pVar12.first.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                 .Ptr.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
       + 8) = 0;
      Key_63.Length = 10;
      Key_63.Data = "avx512vnni";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_63);
      *(undefined1 *)
       (*(long *)pVar12.first.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                 .Ptr.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
       + 8) = 0;
    }
    else {
      Key_58.Length = 4;
      Key_58.Data = "vaes";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_58);
      *(bool *)(*(long *)pVar12.first.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                         .Ptr.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
               + 8) = (uVar8 >> 9 & 1) != 0 && bVar11;
      Key_59.Length = 10;
      Key_59.Data = "vpclmulqdq";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_59);
      *(bool *)(*(long *)pVar12.first.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                         .Ptr.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
               + 8) = (uVar8 >> 10 & 1) != 0 && bVar11;
      Key_60.Length = 10;
      Key_60.Data = "avx512vnni";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_60);
      *(bool *)(*(long *)pVar12.first.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                         .Ptr.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
               + 8) = (uVar8 >> 0xb & 1) != 0 && bVar9;
    }
    bVar10 = 6 < uVar3;
    Key_64.Length = 0xc;
    Key_64.Data = "avx512bitalg";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_64);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = uVar3 >= 7 && ((uVar8 >> 0xc & 1) != 0 && bVar9);
    Key_65.Length = 0xf;
    Key_65.Data = "avx512vpopcntdq";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_65);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0xe) & 1 & bVar10 & bVar9;
    Key_66.Length = 5;
    Key_66.Data = "rdpid";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_66);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(uVar8 >> 0x16) & 1 & bVar10;
    bVar5 = (byte)(uVar8 >> 0x18);
    Key_67.Length = 8;
    Key_67.Data = "cldemote";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_67);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 1 & 1 & bVar10;
    Key_68.Length = 7;
    Key_68.Data = "movdiri";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_68);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 3 & 1 & bVar10;
    Key_69.Length = 9;
    Key_69.Data = "movdir64b";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_69);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = bVar5 >> 4 & 1 & bVar10;
    Key_70.Length = 7;
    Key_70.Data = "pconfig";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_70);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)(local_40 >> 0x12) & 1 & bVar10;
    if (uVar3 < 0xd) {
      Key_72.Length = 8;
      Key_72.Data = "xsaveopt";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_72);
      *(undefined1 *)
       (*(long *)pVar12.first.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                 .Ptr.
                 super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
       + 8) = 0;
      uVar7 = 0;
    }
    else {
      puVar1 = (uint *)cpuid_Processor_Extended_States_info(0xd);
      local_3c = *puVar1;
      local_50 = puVar1[1];
      bVar9 = SUB41(local_3c & 1,0);
      if ((local_3c & 1) != 0) {
        bVar9 = bVar11;
      }
      Key_71.Length = 8;
      Key_71.Data = "xsaveopt";
      pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_71);
      *(bool *)(*(long *)pVar12.first.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                         .Ptr.
                         super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
               + 8) = bVar9;
      uVar7 = (char)(local_3c & 2);
      if ((local_3c & 2) != 0) {
        uVar7 = bVar11;
      }
    }
    Key_73.Length = 6;
    Key_73.Data = "xsavec";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_73);
    *(undefined1 *)
     (*(long *)pVar12.first.
               super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>.
               Ptr.
               super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_> +
     8) = uVar7;
    Key_74.Length = 6;
    Key_74.Data = "xsaves";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_74);
    *(bool *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = 0xc < uVar3 && ((local_3c & 8) != 0 && bVar11);
    if (0x13 < uVar3) {
      lVar2 = cpuid(0x14);
      local_50 = *(uint *)(lVar2 + 4);
    }
    Key_75.Length = 7;
    Key_75.Data = "ptwrite";
    pVar12 = StringMap<bool,_llvm::MallocAllocator>::try_emplace<>(Features,Key_75);
    *(byte *)(*(long *)pVar12.first.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>
             + 8) = (byte)((local_50 & 0x10) >> 4) & 0x13 < uVar3;
  }
  return uVar3 != 0;
}

Assistant:

static bool getX86CpuIDAndInfo(unsigned value, unsigned *rEAX, unsigned *rEBX,
                               unsigned *rECX, unsigned *rEDX) {
#if defined(__GNUC__) || defined(__clang__)
#if defined(__x86_64__)
  // gcc doesn't know cpuid would clobber ebx/rbx. Preserve it manually.
  // FIXME: should we save this for Clang?
  __asm__("movq\t%%rbx, %%rsi\n\t"
          "cpuid\n\t"
          "xchgq\t%%rbx, %%rsi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#elif defined(__i386__)
  __asm__("movl\t%%ebx, %%esi\n\t"
          "cpuid\n\t"
          "xchgl\t%%ebx, %%esi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#else
  return true;
#endif
#elif defined(_MSC_VER)
  // The MSVC intrinsic is portable across x86 and x64.
  int registers[4];
  __cpuid(registers, value);
  *rEAX = registers[0];
  *rEBX = registers[1];
  *rECX = registers[2];
  *rEDX = registers[3];
  return false;
#else
  return true;
#endif
}